

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

void __thiscall ON_wString::MakeUpperOrdinal(ON_wString *this)

{
  int element_count;
  
  CopyArray(this);
  element_count = Length(this);
  if (0 < element_count) {
    MapStringOrdinal(UpperOrdinal,this->m_s,element_count,this->m_s,element_count);
    return;
  }
  return;
}

Assistant:

void ON_wString::MakeUpperOrdinal()
{
 	CopyArray();
  const int length = Length();
  if (length > 0)
    ON_wString::MapStringOrdinal(
    ON_StringMapOrdinalType::UpperOrdinal,
    m_s,
    length,
    m_s,
    length
    );
}